

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::anon_unknown_15::LCSSARewriter::UseRewriter::CreatePhiInstruction
          (UseRewriter *this,BasicBlock *bb,Instruction *value)

{
  CFG *this_00;
  Instruction *pIVar1;
  uint32_t uVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  Instruction *incoming_phi;
  InstructionBuilder builder;
  vector<unsigned_int,_std::allocator<unsigned_int>_> incomings;
  
  incomings.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  incomings.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  incomings.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = this->base_->cfg_;
  uVar2 = BasicBlock::id(bb);
  pvVar3 = CFG::preds(this_00,uVar2);
  lVar5 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
    builder.context_._0_4_ = Instruction::result_id(value);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&incomings,(uint *)&builder);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&incomings,
               (value_type_conflict3 *)
               ((long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + 4;
  }
  InstructionBuilder::InstructionBuilder
            (&builder,this->base_->context_,
             (bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_,
             kAnalysisInstrToBlockMapping);
  uVar2 = Instruction::type_id(this->def_insn_);
  incoming_phi = InstructionBuilder::AddPhi
                           (&builder,uVar2,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &incomings.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,0);
  std::__detail::
  _Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&this->rewritten_,&incoming_phi);
  pIVar1 = incoming_phi;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&incomings.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return pIVar1;
}

Assistant:

inline Instruction* CreatePhiInstruction(BasicBlock* bb,
                                             const Instruction& value) {
      std::vector<uint32_t> incomings;
      const std::vector<uint32_t>& bb_preds = base_->cfg_->preds(bb->id());
      for (size_t i = 0; i < bb_preds.size(); i++) {
        incomings.push_back(value.result_id());
        incomings.push_back(bb_preds[i]);
      }
      InstructionBuilder builder(base_->context_, &*bb->begin(),
                                 IRContext::kAnalysisInstrToBlockMapping);
      Instruction* incoming_phi =
          builder.AddPhi(def_insn_.type_id(), incomings);

      rewritten_.insert(incoming_phi);
      return incoming_phi;
    }